

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::_::SegmentBuilder> __thiscall
kj::
heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int&,capnp::_::ReadLimiter*>
          (kj *this,BuilderArena **params,Id<unsigned_int,_capnp::_::Segment> *params_1,
          word **params_2,uint *params_3,ReadLimiter **params_4)

{
  SegmentId id;
  SegmentWordCount size;
  BuilderArena *arena;
  word *ptr;
  SegmentBuilder *this_00;
  BuilderArena **ppBVar1;
  Id<unsigned_int,_capnp::_::Segment> *pIVar2;
  word **ppwVar3;
  uint *puVar4;
  ReadLimiter **ppRVar5;
  SegmentBuilder *extraout_RDX;
  Own<capnp::_::SegmentBuilder> OVar6;
  ReadLimiter **params_local_4;
  uint *params_local_3;
  word **params_local_2;
  Id<unsigned_int,_capnp::_::Segment> *params_local_1;
  BuilderArena **params_local;
  
  this_00 = (SegmentBuilder *)operator_new(0x38);
  ppBVar1 = fwd<capnp::_::BuilderArena*>(params);
  arena = *ppBVar1;
  pIVar2 = fwd<kj::Id<unsigned_int,capnp::_::Segment>>(params_1);
  id.value = pIVar2->value;
  ppwVar3 = fwd<capnp::word*>(params_2);
  ptr = *ppwVar3;
  puVar4 = fwd<unsigned_int&>(params_3);
  size = *puVar4;
  ppRVar5 = fwd<capnp::_::ReadLimiter*>(params_4);
  capnp::_::SegmentBuilder::SegmentBuilder(this_00,arena,id,ptr,size,*ppRVar5,0);
  Own<capnp::_::SegmentBuilder>::Own
            ((Own<capnp::_::SegmentBuilder> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::_::SegmentBuilder>::instance);
  OVar6.ptr = extraout_RDX;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}